

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall fmt::v11::detail::bigint::remove_leading_zeros(bigint *this)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar2 = (this->bigits_).super_buffer<unsigned_int>.size_;
  iVar3 = (int)uVar2;
  lVar6 = (long)iVar3;
  uVar5 = 1;
  if (iVar3 < 1) {
    uVar5 = uVar2 & 0xffffffff;
  }
  uVar2 = (ulong)(iVar3 + 1);
  do {
    uVar4 = uVar5;
    if (lVar6 < 2) break;
    uVar4 = (ulong)((int)uVar2 - 1);
    lVar1 = lVar6 + -1;
    lVar6 = lVar6 + -1;
    uVar2 = uVar4;
  } while ((this->bigits_).super_buffer<unsigned_int>.ptr_[lVar1] == 0);
  if ((int)uVar4 < 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O1/_deps/fmt-src/include/fmt/base.h"
                ,0x1b6,"negative value");
  }
  if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar4) {
    (*(this->bigits_).super_buffer<unsigned_int>.grow_)((buffer<unsigned_int> *)this,uVar4);
  }
  uVar2 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
  if (uVar4 < uVar2) {
    uVar2 = uVar4;
  }
  (this->bigits_).super_buffer<unsigned_int>.size_ = uVar2;
  return;
}

Assistant:

FMT_CONSTEXPR void remove_leading_zeros() {
    int num_bigits = static_cast<int>(bigits_.size()) - 1;
    while (num_bigits > 0 && bigits_[num_bigits] == 0) --num_bigits;
    bigits_.resize(to_unsigned(num_bigits + 1));
  }